

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__make_pipe(int *fds,int flags)

{
  int iVar1;
  int *piVar2;
  uint in_ESI;
  int *in_RDI;
  int fd;
  int local_4;
  
  if (uv__make_pipe::no_pipe2 == 0) {
    iVar1 = uv__pipe2(in_RDI,in_ESI);
    if (iVar1 == 0) {
      return 0;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x26) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    uv__make_pipe::no_pipe2 = 1;
  }
  iVar1 = pipe(in_RDI);
  fd = (int)in_RDI;
  if (iVar1 == 0) {
    uv__cloexec(fd,in_ESI);
    uv__cloexec(fd,in_ESI);
    if ((in_ESI & 0x800) != 0) {
      uv__nonblock(fd,in_ESI);
      uv__nonblock(fd,in_ESI);
    }
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
  }
  return local_4;
}

Assistant:

int uv__make_pipe(int fds[2], int flags) {
#if defined(__linux__)
  static int no_pipe2;

  if (no_pipe2)
    goto skip;

  if (uv__pipe2(fds, flags | UV__O_CLOEXEC) == 0)
    return 0;

  if (errno != ENOSYS)
    return -errno;

  no_pipe2 = 1;

skip:
#endif

  if (pipe(fds))
    return -errno;

  uv__cloexec(fds[0], 1);
  uv__cloexec(fds[1], 1);

  if (flags & UV__F_NONBLOCK) {
    uv__nonblock(fds[0], 1);
    uv__nonblock(fds[1], 1);
  }

  return 0;
}